

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O0

Branch * testinator::Branch::currentParent(void)

{
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *this;
  reference ppBVar1;
  
  this = getStack();
  ppBVar1 = ::std::
            stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
            ::top(this);
  return *ppBVar1;
}

Assistant:

static Branch& currentParent()
    {
      return *getStack().top();
    }